

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::CoverpointSymbol_const*>::
emplaceRealloc<slang::ast::CoverpointSymbol_const*>
          (SmallVectorBase<slang::ast::CoverpointSymbol_const*> *this,pointer pos,
          CoverpointSymbol **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppCVar3;
  CoverpointSymbol **__result;
  CoverpointSymbol **ppCVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  CoverpointSymbol **args_local;
  pointer pos_local;
  SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::max_size
                    ((SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::calculateGrowth
                       ((SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *)this,
                        *(long *)(this + 8) + 1);
  ppCVar3 = SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::begin
                      ((SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *)this);
  __result = (CoverpointSymbol **)slang::detail::allocArray(capacity,8);
  ppCVar4 = __result + ((long)pos - (long)ppCVar3 >> 3);
  *ppCVar4 = *args;
  ppCVar3 = SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::end
                      ((SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *)this);
  if (pos == ppCVar3) {
    ppCVar3 = SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::begin
                        ((SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::end
                    ((SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *)this);
    std::
    uninitialized_move<slang::ast::CoverpointSymbol_const**,slang::ast::CoverpointSymbol_const**>
              (ppCVar3,(CoverpointSymbol **)ctx,__result);
  }
  else {
    ppCVar3 = SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::begin
                        ((SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *)this);
    std::
    uninitialized_move<slang::ast::CoverpointSymbol_const**,slang::ast::CoverpointSymbol_const**>
              (ppCVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::end
                    ((SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *)this);
    std::
    uninitialized_move<slang::ast::CoverpointSymbol_const**,slang::ast::CoverpointSymbol_const**>
              (pos,(CoverpointSymbol **)ctx,ppCVar4 + 1);
  }
  SmallVectorBase<const_slang::ast::CoverpointSymbol_*>::cleanup
            ((SmallVectorBase<const_slang::ast::CoverpointSymbol_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(CoverpointSymbol ***)this = __result;
  return ppCVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}